

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O2

void __thiscall
booster::aio::basic_socket::set_option
          (basic_socket *this,integer_option_type opt,int v,error_code *e)

{
  native_type __fd;
  int iVar1;
  error_code eVar2;
  int value;
  
  if (opt == receive_buffer_size) {
    iVar1 = 8;
  }
  else {
    if (opt != send_buffer_size) {
      return;
    }
    iVar1 = 7;
  }
  __fd = basic_io_device::native(&this->super_basic_io_device);
  iVar1 = setsockopt(__fd,1,iVar1,&value,4);
  if (iVar1 < 0) {
    eVar2 = socket_details::geterror();
    e->_M_value = eVar2._M_value;
    e->_M_cat = eVar2._M_cat;
  }
  return;
}

Assistant:

void basic_socket::set_option(integer_option_type opt,int v,system::error_code &e)
{
	int value = v;
	char const *p=reinterpret_cast<char const *>(&value);
	int res = 0;
	switch(opt) {
	case receive_buffer_size:
		res=::setsockopt(native(),SOL_SOCKET,SO_RCVBUF,p,sizeof(value));
		break;
	case send_buffer_size:
		res=::setsockopt(native(),SOL_SOCKET,SO_SNDBUF,p,sizeof(value));
		break;
	default:
		;
	}
	if(res < 0)
		e=geterror();
}